

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_price_field_Test::TestBody
          (PriceUpdateDecoderTest_test_decode_price_field_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  AssertionResult gtest_ar;
  PriceField price_field;
  double price;
  string local_58 [32];
  FieldDef field_def;
  string local_30 [40];
  
  price = 43.45664;
  bidfx_public_api::tools::Varint::WriteU64
            ((OutputStream *)&(this->super_PriceUpdateDecoderTest).field_0x18,0x2971880);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"field",(allocator<char> *)&price_field);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(&field_def,1,0x44,local_58,0x56,6);
  std::__cxx11::string::~string(local_58);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&price_field,(FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  local_90.ptr_._0_4_ = 2;
  local_88.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&gtest_ar,"PriceField::DOUBLE","price_field.GetType()",(Type *)&local_90,
             (Type *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x66,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_90.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"price","price_field.GetDouble()",&price,(double *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x67,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::PriceField::~PriceField(&price_field);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_price_field)
{
    double price = 43.45664;
    uint64_t priceTimesMillion = 43456640L;
    Varint::WriteU64(buffer, priceTimesMillion);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::DOUBLE, "field", FieldEncodingEnum::VARINT, 6);
    PriceField price_field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::DOUBLE, price_field.GetType());
    EXPECT_EQ(price, price_field.GetDouble());
}